

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNativeOperators.cpp
# Opt level: O0

void Js::JavascriptNativeOperators::TracePropertyEquivalenceCheck
               (JitEquivalentTypeGuard *guard,Type *type,Type *refType,bool isEquivalent,
               uint failedPropertyIndex)

{
  bool bVar1;
  uint32 uVar2;
  uint uVar3;
  uint uVar4;
  EquivalentTypeCache *pEVar5;
  ScriptContext *this;
  EquivalentPropertyEntry *pEVar6;
  PropertyRecord *pPVar7;
  char16 *pcVar8;
  DynamicTypeHandler *pDVar9;
  DynamicTypeHandler *typeHandler;
  PropertyRecord *propertyRecord_1;
  EquivalentPropertyEntry *pEStack_60;
  PropertyEquivalenceInfo info;
  EquivalentPropertyEntry *refInfo_1;
  PropertyRecord *propertyRecord;
  EquivalentPropertyEntry *refInfo;
  uint pi;
  ScriptContext *scriptContext;
  TypeEquivalenceRecord *record;
  uint propertyCount;
  uint failedPropertyIndex_local;
  bool isEquivalent_local;
  Type *refType_local;
  Type *type_local;
  JitEquivalentTypeGuard *guard_local;
  
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01ec1678,EquivObjTypeSpecPhase);
  if (bVar1) {
    pEVar5 = JitEquivalentTypeGuard::GetCache(guard);
    uVar4 = (pEVar5->record).propertyCount;
    uVar2 = JitEquivalentTypeGuard::GetObjTypeSpecFldId(guard);
    Output::Print(L"EquivObjTypeSpec: checking %u properties on operation %u, (type = 0x%p, ref type = 0x%p):\n"
                  ,(ulong)uVar4,(ulong)uVar2,type,refType);
    pEVar5 = JitEquivalentTypeGuard::GetCache(guard);
    this = Js::Type::GetScriptContext(type);
    if (isEquivalent) {
      if ((DAT_01ec73ca & 1) != 0) {
        Output::Print(L"    <start>, ");
        for (refInfo._4_4_ = 0; refInfo._4_4_ < uVar4; refInfo._4_4_ = refInfo._4_4_ + 1) {
          pEVar6 = (pEVar5->record).properties + refInfo._4_4_;
          pPVar7 = ScriptContext::GetPropertyName(this,pEVar6->propertyId);
          pcVar8 = PropertyRecord::GetBuffer(pPVar7);
          uVar3 = PropertyRecord::GetPropertyId(pPVar7);
          Output::Print(L"%s(#%d)@%ua%dw%d, ",pcVar8,(ulong)uVar3,(ulong)pEVar6->slotIndex,
                        (ulong)(pEVar6->isAuxSlot & 1),(ulong)(pEVar6->mustBeWritable & 1));
        }
        Output::Print(L"<end>\n");
      }
    }
    else {
      pEStack_60 = (pEVar5->record).properties + failedPropertyIndex;
      PropertyEquivalenceInfo::PropertyEquivalenceInfo
                ((PropertyEquivalenceInfo *)((long)&propertyRecord_1 + 4),0xffff,false,false);
      pPVar7 = ScriptContext::GetPropertyName(this,pEStack_60->propertyId);
      bVar1 = DynamicType::Is(type);
      if (bVar1) {
        pDVar9 = DynamicType::GetTypeHandler((DynamicType *)type);
        (*pDVar9->_vptr_DynamicTypeHandler[0xd])(pDVar9,pPVar7,(long)&propertyRecord_1 + 4);
      }
      pcVar8 = PropertyRecord::GetBuffer(pPVar7);
      uVar4 = PropertyRecord::GetPropertyId(pPVar7);
      uVar2 = JitEquivalentTypeGuard::GetObjTypeSpecFldId(guard);
      Output::Print(L"EquivObjTypeSpec: check failed for %s (#%d) on operation %u:\n",pcVar8,
                    (ulong)uVar4,(ulong)uVar2);
      Output::Print(L"    type = 0x%p, ref type = 0x%p, slot = 0x%u (%d), ref slot = 0x%u (%d), is writable = %d, required writable = %d\n"
                    ,type,refType,(ulong)propertyRecord_1._4_2_,(ulong)pEStack_60->slotIndex,
                    (ulong)(propertyRecord_1._6_1_ & 1),(uint)(pEStack_60->isAuxSlot & 1),
                    (uint)(propertyRecord_1._7_1_ & 1),(uint)(pEStack_60->mustBeWritable & 1));
    }
    Output::Flush();
  }
  return;
}

Assistant:

void JavascriptNativeOperators::TracePropertyEquivalenceCheck(const JitEquivalentTypeGuard* guard, const Type* type, const Type* refType, bool isEquivalent, uint failedPropertyIndex)
    {
        if (PHASE_TRACE1(Js::EquivObjTypeSpecPhase))
        {
            uint propertyCount = guard->GetCache()->record.propertyCount;

            Output::Print(_u("EquivObjTypeSpec: checking %u properties on operation %u, (type = 0x%p, ref type = 0x%p):\n"),
                propertyCount, guard->GetObjTypeSpecFldId(), type, refType);

            const Js::TypeEquivalenceRecord& record = guard->GetCache()->record;
            ScriptContext* scriptContext = type->GetScriptContext();
            if (isEquivalent)
            {
                if (Js::Configuration::Global.flags.Verbose)
                {
                    Output::Print(_u("    <start>, "));
                    for (uint pi = 0; pi < propertyCount; pi++)
                    {
                        const EquivalentPropertyEntry* refInfo = &record.properties[pi];
                        const PropertyRecord* propertyRecord = scriptContext->GetPropertyName(refInfo->propertyId);
                        Output::Print(_u("%s(#%d)@%ua%dw%d, "), propertyRecord->GetBuffer(), propertyRecord->GetPropertyId(), refInfo->slotIndex, refInfo->isAuxSlot, refInfo->mustBeWritable);
                    }
                    Output::Print(_u("<end>\n"));
                }
            }
            else
            {
                const EquivalentPropertyEntry* refInfo = &record.properties[failedPropertyIndex];
                Js::PropertyEquivalenceInfo info(Constants::NoSlot, false, false);
                const PropertyRecord* propertyRecord = scriptContext->GetPropertyName(refInfo->propertyId);
                if (DynamicType::Is(type))
                {
                    Js::DynamicTypeHandler* typeHandler = (static_cast<const DynamicType*>(type))->GetTypeHandler();
                    typeHandler->GetPropertyEquivalenceInfo(propertyRecord, info);
                }

                Output::Print(_u("EquivObjTypeSpec: check failed for %s (#%d) on operation %u:\n"),
                    propertyRecord->GetBuffer(), propertyRecord->GetPropertyId(), guard->GetObjTypeSpecFldId());
                Output::Print(_u("    type = 0x%p, ref type = 0x%p, slot = 0x%u (%d), ref slot = 0x%u (%d), is writable = %d, required writable = %d\n"),
                    type, refType, info.slotIndex, refInfo->slotIndex, info.isAuxSlot, refInfo->isAuxSlot, info.isWritable, refInfo->mustBeWritable);
            }

            Output::Flush();
        }
    }